

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.cpp
# Opt level: O0

void __thiscall
TPZDohrPrecond<std::complex<double>,_TPZDohrSubstructCondense<std::complex<double>_>_>::ComputeV1
          (TPZDohrPrecond<std::complex<double>,_TPZDohrSubstructCondense<std::complex<double>_>_>
           *this,TPZFMatrix<std::complex<double>_> *x,TPZFMatrix<std::complex<double>_> *v1)

{
  long *plVar1;
  bool bVar2;
  TPZDohrSubstructCondense<std::complex<double>_> *this_00;
  reference pTVar3;
  TPZDohrSubstructCondense<std::complex<double>_> *v1_local_00;
  TPZBaseMatrix *in_RSI;
  TPZDohrAssembly<std::complex<double>_> *in_RDI;
  TPZFMatrix<std::complex<double>_> CoarseSolution_local;
  TPZFMatrix<std::complex<double>_> v1_local;
  TPZFMatrix<std::complex<double>_> CoarseSolution;
  TPZFMatrix<std::complex<double>_> CoarseResidual_local;
  TPZFMatrix<std::complex<double>_> xloc;
  int isub;
  const_iterator it;
  TPZFMatrix<std::complex<double>_> CoarseResidual;
  undefined4 in_stack_fffffffffffffbd8;
  DecomposeType in_stack_fffffffffffffbdc;
  TPZDohrSubstructCondense<std::complex<double>_> *in_stack_fffffffffffffbe0;
  TPZFMatrix<std::complex<double>_> *in_stack_fffffffffffffc08;
  TPZDohrSubstructCondense<std::complex<double>_> *in_stack_fffffffffffffc10;
  TPZDohrAssembly<std::complex<double>_> *in_stack_fffffffffffffc18;
  int64_t in_stack_fffffffffffffc40;
  int64_t in_stack_fffffffffffffc48;
  TPZFMatrix<std::complex<double>_> *in_stack_fffffffffffffc50;
  _Self local_2a0;
  _List_node_base *local_298;
  undefined1 local_290 [144];
  _List_node_base *local_200;
  _Self local_d8;
  _List_node_base *local_d0;
  int local_c4;
  _List_const_iterator<TPZAutoPointer<TPZDohrSubstructCondense<std::complex<double>_>_>_>
  local_c0 [3];
  undefined1 local_a8 [152];
  TPZBaseMatrix *local_10;
  
  local_10 = in_RSI;
  TPZBaseMatrix::Cols(in_RSI);
  TPZFMatrix<std::complex<double>_>::TPZFMatrix
            (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
  TPZFMatrix<std::complex<double>_>::Zero
            ((TPZFMatrix<std::complex<double>_> *)in_stack_fffffffffffffbe0);
  std::_List_const_iterator<TPZAutoPointer<TPZDohrSubstructCondense<std::complex<double>_>_>_>::
  _List_const_iterator(local_c0);
  local_c4 = 0;
  local_d0 = (_List_node_base *)
             std::__cxx11::
             list<TPZAutoPointer<TPZDohrSubstructCondense<std::complex<double>_>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<std::complex<double>_>_>_>_>
             ::begin((list<TPZAutoPointer<TPZDohrSubstructCondense<std::complex<double>_>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<std::complex<double>_>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
  local_c0[0]._M_node = local_d0;
  while( true ) {
    local_d8._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<TPZAutoPointer<TPZDohrSubstructCondense<std::complex<double>_>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<std::complex<double>_>_>_>_>
         ::end((list<TPZAutoPointer<TPZDohrSubstructCondense<std::complex<double>_>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<std::complex<double>_>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
    bVar2 = std::operator!=(local_c0,&local_d8);
    if (!bVar2) break;
    TPZFMatrix<std::complex<double>_>::TPZFMatrix
              ((TPZFMatrix<std::complex<double>_> *)in_stack_fffffffffffffc10);
    TPZFMatrix<std::complex<double>_>::TPZFMatrix
              ((TPZFMatrix<std::complex<double>_> *)in_stack_fffffffffffffc10);
    in_stack_fffffffffffffc18 =
         TPZAutoPointer<TPZDohrAssembly<std::complex<double>_>_>::operator->
                   ((TPZAutoPointer<TPZDohrAssembly<std::complex<double>_>_> *)&in_RDI[1].fFineEqs);
    TPZDohrAssembly<std::complex<double>_>::Extract
              (in_RDI,(int)((ulong)in_stack_fffffffffffffc18 >> 0x20),
               (TPZFMatrix<std::complex<double>_> *)in_stack_fffffffffffffc10,
               in_stack_fffffffffffffc08);
    pTVar3 = std::
             _List_const_iterator<TPZAutoPointer<TPZDohrSubstructCondense<std::complex<double>_>_>_>
             ::operator*((_List_const_iterator<TPZAutoPointer<TPZDohrSubstructCondense<std::complex<double>_>_>_>
                          *)in_stack_fffffffffffffbe0);
    in_stack_fffffffffffffc10 =
         TPZAutoPointer<TPZDohrSubstructCondense<std::complex<double>_>_>::operator->(pTVar3);
    TPZDohrSubstructCondense<std::complex<double>_>::Contribute_rc_local
              (in_stack_fffffffffffffbe0,
               (TPZFMatrix<std::complex<double>_> *)
               CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
               (TPZFMatrix<std::complex<double>_> *)0x1f8a3b6);
    in_stack_fffffffffffffc08 =
         (TPZFMatrix<std::complex<double>_> *)
         TPZAutoPointer<TPZDohrAssembly<std::complex<double>_>_>::operator->
                   ((TPZAutoPointer<TPZDohrAssembly<std::complex<double>_>_> *)&in_RDI[1].fFineEqs);
    TPZDohrAssembly<std::complex<double>_>::AssembleCoarse
              (in_RDI,(int)((ulong)in_stack_fffffffffffffc18 >> 0x20),
               (TPZFMatrix<std::complex<double>_> *)in_stack_fffffffffffffc10,
               in_stack_fffffffffffffc08);
    TPZFMatrix<std::complex<double>_>::~TPZFMatrix((TPZFMatrix<std::complex<double>_> *)0x1f8a3fd);
    TPZFMatrix<std::complex<double>_>::~TPZFMatrix((TPZFMatrix<std::complex<double>_> *)0x1f8a40a);
    local_200 = (_List_node_base *)
                std::
                _List_const_iterator<TPZAutoPointer<TPZDohrSubstructCondense<std::complex<double>_>_>_>
                ::operator++(local_c0,0);
    local_c4 = local_c4 + 1;
  }
  TPZStepSolver<std::complex<double>_>::SetDirect
            ((TPZStepSolver<std::complex<double>_> *)in_stack_fffffffffffffbe0,
             in_stack_fffffffffffffbdc);
  TPZBaseMatrix::Cols(local_10);
  TPZFMatrix<std::complex<double>_>::TPZFMatrix
            (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
  plVar1 = (long *)(in_RDI->fCoarseEqs).fNElements;
  (**(code **)(*plVar1 + 0x58))(plVar1,local_a8,local_290,0);
  local_c4 = 0;
  local_298 = (_List_node_base *)
              std::__cxx11::
              list<TPZAutoPointer<TPZDohrSubstructCondense<std::complex<double>_>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<std::complex<double>_>_>_>_>
              ::begin((list<TPZAutoPointer<TPZDohrSubstructCondense<std::complex<double>_>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<std::complex<double>_>_>_>_>
                       *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
  local_c0[0]._M_node = local_298;
  while( true ) {
    local_2a0._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<TPZAutoPointer<TPZDohrSubstructCondense<std::complex<double>_>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<std::complex<double>_>_>_>_>
         ::end((list<TPZAutoPointer<TPZDohrSubstructCondense<std::complex<double>_>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<std::complex<double>_>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
    bVar2 = std::operator!=(local_c0,&local_2a0);
    if (!bVar2) break;
    TPZFMatrix<std::complex<double>_>::TPZFMatrix
              ((TPZFMatrix<std::complex<double>_> *)in_stack_fffffffffffffc10);
    TPZFMatrix<std::complex<double>_>::TPZFMatrix
              ((TPZFMatrix<std::complex<double>_> *)in_stack_fffffffffffffc10);
    this_00 = (TPZDohrSubstructCondense<std::complex<double>_> *)
              TPZAutoPointer<TPZDohrAssembly<std::complex<double>_>_>::operator->
                        ((TPZAutoPointer<TPZDohrAssembly<std::complex<double>_>_> *)
                         &in_RDI[1].fFineEqs);
    TPZDohrAssembly<std::complex<double>_>::ExtractCoarse
              (in_RDI,(int)((ulong)in_stack_fffffffffffffc18 >> 0x20),
               (TPZFMatrix<std::complex<double>_> *)in_stack_fffffffffffffc10,
               in_stack_fffffffffffffc08);
    pTVar3 = std::
             _List_const_iterator<TPZAutoPointer<TPZDohrSubstructCondense<std::complex<double>_>_>_>
             ::operator*((_List_const_iterator<TPZAutoPointer<TPZDohrSubstructCondense<std::complex<double>_>_>_>
                          *)in_stack_fffffffffffffbe0);
    v1_local_00 = TPZAutoPointer<TPZDohrSubstructCondense<std::complex<double>_>_>::operator->
                            (pTVar3);
    TPZDohrSubstructCondense<std::complex<double>_>::Contribute_v1_local
              (this_00,(TPZFMatrix<std::complex<double>_> *)v1_local_00,
               (TPZFMatrix<std::complex<double>_> *)in_stack_fffffffffffffbe0);
    in_stack_fffffffffffffbe0 =
         (TPZDohrSubstructCondense<std::complex<double>_> *)
         TPZAutoPointer<TPZDohrAssembly<std::complex<double>_>_>::operator->
                   ((TPZAutoPointer<TPZDohrAssembly<std::complex<double>_>_> *)&in_RDI[1].fFineEqs);
    TPZDohrAssembly<std::complex<double>_>::Assemble
              (in_RDI,(int)((ulong)in_stack_fffffffffffffc18 >> 0x20),
               (TPZFMatrix<std::complex<double>_> *)in_stack_fffffffffffffc10,
               in_stack_fffffffffffffc08);
    TPZFMatrix<std::complex<double>_>::~TPZFMatrix((TPZFMatrix<std::complex<double>_> *)0x1f8a63b);
    TPZFMatrix<std::complex<double>_>::~TPZFMatrix((TPZFMatrix<std::complex<double>_> *)0x1f8a648);
    std::_List_const_iterator<TPZAutoPointer<TPZDohrSubstructCondense<std::complex<double>_>_>_>::
    operator++(local_c0,0);
    local_c4 = local_c4 + 1;
  }
  TPZFMatrix<std::complex<double>_>::~TPZFMatrix((TPZFMatrix<std::complex<double>_> *)0x1f8a6d8);
  TPZFMatrix<std::complex<double>_>::~TPZFMatrix((TPZFMatrix<std::complex<double>_> *)0x1f8a6e5);
  return;
}

Assistant:

void TPZDohrPrecond<TVar, TSubStruct>::ComputeV1(const TPZFMatrix<TVar> &x, TPZFMatrix<TVar> &v1) const
{
	/* Computing r(c) */
	TPZFMatrix<TVar> CoarseResidual(fNumCoarse,x.Cols());
	CoarseResidual.Zero();
	typename std::list<TPZAutoPointer<TSubStruct> >::const_iterator it;
	
	int isub = 0;
	for(it= fGlobal.begin(); it != fGlobal.end(); it++, isub++) {
		TPZFMatrix<TVar> xloc, CoarseResidual_local;
		fAssemble->Extract(isub,x,xloc);
		//		(*it)->LoadWeightedResidual(xloc);
		(*it)->Contribute_rc_local(xloc,CoarseResidual_local);
		fAssemble->AssembleCoarse(isub,CoarseResidual_local,CoarseResidual);
	}
#ifdef PZ_LOG
	{
		std::stringstream sout;
		CoarseResidual.Print("Coarse Residual",sout);
		if (logger.isDebugEnabled())
		{
			LOGPZ_DEBUG(logger, sout.str());
		}
	}
#endif
	/* Computing K(c)_inverted*r(c) and stores it in "product" */
	fCoarse->SetDirect(ELDLt);
	//Dado global
	TPZFMatrix<TVar> CoarseSolution(fNumCoarse,x.Cols());
	fCoarse->Solve(CoarseResidual,CoarseSolution);
#ifdef PZ_LOG
	{
		std::stringstream sout;
		CoarseSolution.Print("CoarseSolution",sout);
		if (logger.isDebugEnabled())
		{
			LOGPZ_DEBUG(logger, sout.str());
		}
	}
#endif
	isub=0;
	//Criar tarefa que execute a distribuicao de cada elemento do fGlobal
	for(it= fGlobal.begin(); it != fGlobal.end(); it++,isub++)
	{
		// Gerenciamento Global->Local sobre o product
		//product é administrado pelo DM mas permanece no processador 0
		// tarefa separada, expansao da solucao coarse
		TPZFMatrix<TVar> v1_local,CoarseSolution_local;
		fAssemble->ExtractCoarse(isub,CoarseSolution,CoarseSolution_local);
		(*it)->Contribute_v1_local(v1_local,CoarseSolution_local);
		
		fAssemble->Assemble(isub,v1_local,v1);
	}
#ifdef PZ_LOG
	{
		std::stringstream sout;
		v1.Print("v1 vector",sout);
		if (loggerv1v2.isDebugEnabled())
		{
			LOGPZ_DEBUG(loggerv1v2, sout.str())
		}
	}
#endif
}